

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.c
# Opt level: O0

void us_socket_context_on_end
               (int ssl,us_socket_context_t *context,_func_us_socket_t_ptr_us_socket_t_ptr *on_end)

{
  _func_us_internal_ssl_socket_t_ptr_us_internal_ssl_socket_t_ptr *in_RDX;
  us_internal_ssl_socket_context_t *in_RSI;
  int in_EDI;
  
  if (in_EDI == 0) {
    (in_RSI->sc).on_end = (_func_us_socket_t_ptr_us_socket_t_ptr *)in_RDX;
  }
  else {
    us_internal_ssl_socket_context_on_end(in_RSI,in_RDX);
  }
  return;
}

Assistant:

void us_socket_context_on_end(int ssl, struct us_socket_context_t *context, struct us_socket_t *(*on_end)(struct us_socket_t *)) {
#ifndef LIBUS_NO_SSL
    if (ssl) {
        us_internal_ssl_socket_context_on_end((struct us_internal_ssl_socket_context_t *) context, (struct us_internal_ssl_socket_t * (*)(struct us_internal_ssl_socket_t *)) on_end);
        return;
    }
#endif

    context->on_end = on_end;
}